

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::BuildStructConstructor
          (SwiftGenerator *this,StructDef *struct_def)

{
  FieldDef *s;
  bool bVar1;
  reference ppFVar2;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  allocator<char> local_169;
  string local_168;
  string local_148;
  allocator<char> local_121;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined1 auStack_b8 [8];
  Type type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_80;
  const_iterator it;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) {",&local_39);
  CodeWriter::operator+=(&this->code_,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  Indent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"let {{ACCESS}} = Struct(bb: bb, position: o)",
             (allocator<char> *)((long)&it._M_current + 7));
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_current + 7));
  local_80._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(local_18->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(local_18->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_80);
    s = *ppFVar2;
    if ((s->deprecated & 1U) == 0) {
      auStack_b8._0_4_ = (s->value).type.base_type;
      auStack_b8._4_4_ = (s->value).type.element;
      type._0_8_ = (s->value).type.struct_def;
      type.struct_def = (StructDef *)(s->value).type.enum_def;
      type.enum_def = *(EnumDef **)&(s->value).type.fixed_length;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"FIELDVAR",&local_d9);
      IdlNamer::Variable_abi_cxx11_(&local_100,&this->namer_,s);
      CodeWriter::SetValue(&this->code_,&local_d8,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"VALUETYPE",&local_121);
      GenType_abi_cxx11_(&local_148,this,(Type *)auStack_b8,false);
      CodeWriter::SetValue(&this->code_,&local_120,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"OFFSET",&local_169);
      NumToString<unsigned_short>(&local_190,(s->value).offset);
      CodeWriter::SetValue(&this->code_,&local_168,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
      bVar1 = IsScalar(auStack_b8._0_4_);
      if (bVar1) {
        bVar1 = IsEnum((Type *)auStack_b8);
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,"VALUETYPE",&local_1b1);
          GenTypeBasic_abi_cxx11_(&local_1d8,this,&(s->value).type,false);
          CodeWriter::SetValue(&this->code_,&local_1b0,&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator(&local_1b1);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,
                   "_{{FIELDVAR}} = {{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: {{OFFSET}})",
                   &local_1f9);
        CodeWriter::operator+=(&this->code_,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,
                   "_{{FIELDVAR}} = {{VALUETYPE}}({{ACCESS}}.bb, o: {{ACCESS}}.position + {{OFFSET}})"
                   ,&local_221);
        CodeWriter::operator+=(&this->code_,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
      }
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_80);
  }
  Outdent(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"}\n",&local_249);
  CodeWriter::operator+=(&this->code_,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  return;
}

Assistant:

void BuildStructConstructor(const StructDef &struct_def) {
    code_ += "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) {";
    Indent();
    code_ += "let {{ACCESS}} = Struct(bb: bb, position: o)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto type = field.value.type;
      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("VALUETYPE", GenType(type));
      code_.SetValue("OFFSET", NumToString(field.value.offset));
      if (IsScalar(type.base_type)) {
        if (IsEnum(type))
          code_.SetValue("VALUETYPE", GenTypeBasic(field.value.type, false));
        code_ +=
            "_{{FIELDVAR}} = {{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, "
            "at: {{OFFSET}})";
      } else {
        code_ +=
            "_{{FIELDVAR}} = {{VALUETYPE}}({{ACCESS}}.bb, o: "
            "{{ACCESS}}.position + {{OFFSET}})";
      }
    }
    Outdent();
    code_ += "}\n";
  }